

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

void address_space_stq_internal_sparc64
               (uc_struct_conflict9 *uc,AddressSpace *as,hwaddr addr,uint64_t val,MemTxAttrs attrs,
               MemTxResult *result,device_endian endian)

{
  hwaddr mr_00;
  MemTxResult *data;
  AddressSpace *uc_00;
  _Bool _Var1;
  MemOp_conflict1 MVar2;
  MemTxResult local_5c;
  _Bool release_lock;
  ram_addr_t rStack_58;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion *mr;
  uint8_t *ptr;
  MemTxResult *result_local;
  uint64_t val_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  uc_struct_conflict9 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 8;
  ptr = (uint8_t *)result;
  result_local = (MemTxResult *)val;
  val_local = addr;
  addr_local = (hwaddr)as;
  as_local = (AddressSpace *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate(as,addr,&stack0xffffffffffffffa8,&addr1,true,attrs);
  if (7 < addr1) {
    _Var1 = memory_access_is_direct((MemoryRegion *)l,true);
    if (_Var1) {
      mr = (MemoryRegion *)
           qemu_map_ram_ptr_sparc64
                     (*(uc_struct_conflict9 **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_58);
      if (endian == DEVICE_BIG_ENDIAN) {
        stq_be_p(mr,(uint64_t)result_local);
      }
      else if (endian == DEVICE_LITTLE_ENDIAN) {
        stq_le_p(mr,(uint64_t)result_local);
      }
      else {
        stq_be_p(mr,(uint64_t)result_local);
      }
      invalidate_and_set_dirty((MemoryRegion *)l,rStack_58,8);
      local_5c = 0;
      goto LAB_00dfa305;
    }
  }
  prepare_mmio_access((MemoryRegion *)l);
  uc_00 = as_local;
  data = result_local;
  mr_00 = l;
  MVar2 = devend_memop(endian);
  local_5c = memory_region_dispatch_write_sparc64
                       ((uc_struct_conflict9 *)uc_00,(MemoryRegion *)mr_00,rStack_58,(uint64_t)data,
                        MVar2 | MO_64,uc_local._4_4_);
LAB_00dfa305:
  if (ptr != (uint8_t *)0x0) {
    *(MemTxResult *)ptr = local_5c;
  }
  return;
}

Assistant:

static void glue(address_space_stq_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint64_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 8;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 8 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_64 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stq_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stq_be_p(ptr, val);
            break;
        default:
            stq_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 8);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}